

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

int corpus_ckpt_set_interval(char *fn)

{
  int iVar1;
  uint32 local_28;
  uint32 local_24;
  uint32 rl;
  uint32 o;
  FILE *fp;
  char *fn_local;
  
  fp = (FILE *)fn;
  _rl = fopen(fn,"r");
  if (_rl == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                   ,0x1e7,"Can\'t open ckpt file %s",fp);
    fn_local._4_4_ = -1;
  }
  else {
    iVar1 = __isoc99_fscanf(_rl,"%u %u",&local_24,&local_28);
    if (iVar1 == 2) {
      fclose(_rl);
      fn_local._4_4_ = corpus_set_interval(local_24,local_28);
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
              ,0x1ed,"Problems reading ckpt file %s\n",fp);
      fclose(_rl);
      fn_local._4_4_ = -1;
    }
  }
  return fn_local._4_4_;
}

Assistant:

int
corpus_ckpt_set_interval(const char *fn)
{
    FILE *fp;
    uint32 o, rl;

    fp = fopen(fn, "r");
    if (fp == NULL) {
	E_ERROR_SYSTEM("Can't open ckpt file %s", fn);

	return S3_ERROR;
    }

    if (fscanf(fp, "%u %u", &o, &rl) != 2) {
	E_ERROR("Problems reading ckpt file %s\n", fn);
	fclose(fp);

	return S3_ERROR;
    }

    fclose(fp);

    return corpus_set_interval(o, rl);
}